

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec2 __thiscall djb::tab_r::cdfv(tab_r *this,vec2 *u,float_t zi)

{
  int iVar1;
  pointer pvVar2;
  vec2 vVar3;
  vec2 vVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar9;
  float local_98;
  float_t w2;
  float_t w1;
  int i2;
  undefined1 local_88 [16];
  undefined1 local_78 [28];
  int k2;
  int k1;
  int j2;
  int j1;
  int i1;
  undefined1 local_48 [24];
  
  local_88._0_4_ = u->x;
  local_78._0_4_ = u->y;
  fVar8 = acosf(zi);
  spline::uwrap_edge((float_t)local_88._0_4_,0x40,&i1,&i2,&w1);
  spline::uwrap_edge((float_t)local_78._0_4_,0x100,&j1,&j2,&w2);
  spline::uwrap_edge(fVar8 * 0.63661975 * fVar8 * 0.63661975,0x10,&k1,&k2,&local_98);
  iVar1 = k1 * 0x4000 + j1 * 0x40;
  pvVar2 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = k1 * 0x4000 + j2 * 0x40;
  iVar5 = j1 * 0x40 + k2 * 0x4000;
  iVar7 = k2 * 0x4000 + j2 * 0x40;
  vVar3 = spline::lerp<djb::vec2>(pvVar2 + (iVar1 + i1),pvVar2 + (iVar1 + i2),w1);
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_4_ = vVar3.x;
  local_78._4_4_ = vVar3.y;
  local_78._12_4_ = extraout_XMM0_Dd;
  vVar3 = spline::lerp<djb::vec2>(pvVar2 + (iVar6 + i1),pvVar2 + (iVar6 + i2),w1);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_4_ = vVar3.x;
  local_48._4_4_ = vVar3.y;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  vVar3 = spline::lerp<djb::vec2>(pvVar2 + (iVar5 + i1),pvVar2 + (iVar5 + i2),w1);
  local_88._8_4_ = extraout_XMM0_Dc_01;
  local_88._0_4_ = vVar3.x;
  local_88._4_4_ = vVar3.y;
  local_88._12_4_ = extraout_XMM0_Dd_01;
  vVar4 = spline::lerp<djb::vec2>(pvVar2 + (i1 + iVar7),pvVar2 + (iVar7 + i2),w1);
  fVar8 = ((float)local_48._0_4_ - (float)local_78._0_4_) * w2 + (float)local_78._0_4_;
  fVar9 = ((float)local_48._4_4_ - (float)local_78._4_4_) * w2 + (float)local_78._4_4_;
  vVar3.y = (((vVar4.y - (float)local_88._4_4_) * w2 + (float)local_88._4_4_) - fVar9) * local_98 +
            fVar9;
  vVar3.x = (((vVar4.x - (float)local_88._0_4_) * w2 + (float)local_88._0_4_) - fVar8) * local_98 +
            fVar8;
  return vVar3;
}

Assistant:

vec2 tab_r::cdfv(const vec2 &u, float_t zi) const
{
	int res1 = 64;
	int res2 = 256;
	int res3 = 16;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(zi) * (2 / m_pi()));

	return spline::eval3d(m_cdf, res1, res2, res3,
	                      spline::uwrap_edge, u1,
	                      spline::uwrap_edge, u2,
	                      spline::uwrap_edge, u3);
}